

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QString * __thiscall
QtPrivate::QCalendarDateValidator::currentText
          (QString *__return_storage_ptr__,QCalendarDateValidator *this,undefined8 param_3)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar5 = (uint)(this->m_separators).d.size;
  if (0 < (int)uVar5) {
    pSVar1 = (this->m_tokens).
             super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar2 = (this->m_tokens).
             super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    uVar6 = 0;
    do {
      QString::append((QString *)__return_storage_ptr__);
      if ((long)uVar6 < (long)(int)((ulong)((long)pSVar1 - (long)pSVar2) >> 4)) {
        pSVar3 = (this->m_tokens).
                 super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_tokens).
                          super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4) <= uVar6)
        {
          currentText();
          goto LAB_003c6f5a;
        }
        if (uVar6 == (uint)this->m_currentToken) {
          (**(code **)(**(long **)((long)&pSVar3->validator + lVar7) + 0x28))(local_50);
        }
        else {
          plVar4 = *(long **)((long)&pSVar3->validator + lVar7);
          (**(code **)(*plVar4 + 0x30))
                    (local_50,plVar4,(this->m_currentDate).jd,param_3,
                     *(undefined4 *)((long)&pSVar3->repeat + lVar7));
        }
        QString::append((QString *)__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003c6f5a:
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateValidator::currentText(QCalendar cal) const
{
    QString str;
    const int numSeps = m_separators.size();
    const int numTokens = int(m_tokens.size());
    for (int i = 0; i < numSeps; ++i) {
        str += m_separators.at(i);
        if (i < numTokens) {
            const SectionToken &token = m_tokens[i];
            if (i == m_currentToken)
                str += token.validator->text();
            else
                str += token.validator->text(m_currentDate, cal, token.repeat);
        }
    }
    return str;
}